

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.h
# Opt level: O2

void __thiscall
Catch::StreamingReporterBase<Catch::XmlReporter>::testRunEnded
          (StreamingReporterBase<Catch::XmlReporter> *this,TestRunStats *param_1)

{
  LazyStat<Catch::TestCaseInfo>::reset(&this->currentTestCaseInfo);
  LazyStat<Catch::GroupInfo>::reset(&this->currentGroupInfo);
  LazyStat<Catch::TestRunInfo>::reset(&this->currentTestRunInfo);
  return;
}

Assistant:

void testRunEnded(TestRunStats const& /* _testRunStats */) override {
            currentTestCaseInfo.reset();
            currentGroupInfo.reset();
            currentTestRunInfo.reset();
        }